

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2f *value)

{
  bool bVar1;
  float2 v;
  texcoord2f local_10;
  
  bVar1 = ParseBasicTypeTuple<float,2ul>(this,(array<float,_2UL> *)&local_10);
  if (bVar1) {
    *value = local_10;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2f *value) {
  value::float2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = v[0];
    value->t = v[1];
    return true;
  }
  return false;
}